

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cpp
# Opt level: O0

void anon_unknown.dwarf_3433b::ALbandpass_setParamf(ALfilter *filter,ALenum param,float val)

{
  ALenum AVar1;
  filter_exception *this;
  uint in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  
  if (in_ESI == 1) {
    if ((in_XMM0_Da < 0.0) || (4.0 < in_XMM0_Da)) {
      _AVar1 = (ALenum)__cxa_allocate_exception(0x30);
      filter_exception::filter_exception
                ((filter_exception *)(double)in_XMM0_Da,_AVar1,(char *)0xa003,
                 "Band-pass gain %f out of range");
      __cxa_throw((undefined8)_AVar1,&(anonymous_namespace)::filter_exception::typeinfo,
                  filter_exception::~filter_exception);
    }
    *(float *)(in_RDI + 4) = in_XMM0_Da;
  }
  else if (in_ESI == 2) {
    if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
      _AVar1 = (ALenum)__cxa_allocate_exception(0x30);
      filter_exception::filter_exception
                ((filter_exception *)(double)in_XMM0_Da,_AVar1,(char *)0xa003,
                 "Band-pass gainlf %f out of range");
      __cxa_throw((undefined8)_AVar1,&(anonymous_namespace)::filter_exception::typeinfo,
                  filter_exception::~filter_exception);
    }
    *(float *)(in_RDI + 0x10) = in_XMM0_Da;
  }
  else {
    if (in_ESI != 3) {
      this = (filter_exception *)__cxa_allocate_exception(0x30);
      filter_exception::filter_exception
                (this,0xa002,"Invalid band-pass float property 0x%04x",(ulong)in_ESI);
      __cxa_throw(this,&(anonymous_namespace)::filter_exception::typeinfo,
                  filter_exception::~filter_exception);
    }
    if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
      _AVar1 = (ALenum)__cxa_allocate_exception(0x30);
      filter_exception::filter_exception
                ((filter_exception *)(double)in_XMM0_Da,_AVar1,(char *)0xa003,
                 "Band-pass gainhf %f out of range");
      __cxa_throw((undefined8)_AVar1,&(anonymous_namespace)::filter_exception::typeinfo,
                  filter_exception::~filter_exception);
    }
    *(float *)(in_RDI + 8) = in_XMM0_Da;
  }
  return;
}

Assistant:

void ALbandpass_setParamf(ALfilter *filter, ALenum param, float val)
{
    switch(param)
    {
    case AL_BANDPASS_GAIN:
        if(!(val >= FILTER_MIN_GAIN && val <= FILTER_MAX_GAIN))
            throw filter_exception{AL_INVALID_VALUE, "Band-pass gain %f out of range", val};
        filter->Gain = val;
        break;

    case AL_BANDPASS_GAINHF:
        if(!(val >= AL_BANDPASS_MIN_GAINHF && val <= AL_BANDPASS_MAX_GAINHF))
            throw filter_exception{AL_INVALID_VALUE, "Band-pass gainhf %f out of range", val};
        filter->GainHF = val;
        break;

    case AL_BANDPASS_GAINLF:
        if(!(val >= AL_BANDPASS_MIN_GAINLF && val <= AL_BANDPASS_MAX_GAINLF))
            throw filter_exception{AL_INVALID_VALUE, "Band-pass gainlf %f out of range", val};
        filter->GainLF = val;
        break;

    default:
        throw filter_exception{AL_INVALID_ENUM, "Invalid band-pass float property 0x%04x", param};
    }
}